

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacReadVer.c
# Opt level: O0

int Psr_ManUtilSkipUntil(Psr_Man_t *p,char c)

{
  int iVar1;
  char c_local;
  Psr_Man_t *p_local;
  
  while( true ) {
    if (p->pLimit <= p->pCur) {
      return 0;
    }
    iVar1 = Psr_ManIsChar(p,c);
    if (iVar1 != 0) break;
    iVar1 = Psr_ManUtilSkipComments(p);
    if ((iVar1 == 0) && (iVar1 = Psr_ManUtilSkipName(p), iVar1 == 0)) {
      p->pCur = p->pCur + 1;
    }
  }
  return 1;
}

Assistant:

static inline int Psr_ManUtilSkipUntil( Psr_Man_t * p, char c )
{
    while ( p->pCur < p->pLimit )
    {
        if ( Psr_ManIsChar(p, c) )
            return 1;
        if ( Psr_ManUtilSkipComments(p) )
            continue;
        if ( Psr_ManUtilSkipName(p) )
            continue;
        p->pCur++;
    }
    return 0;
}